

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DTDScanner::scanTextDecl(DTDScanner *this)

{
  XMLBufferMgr *pXVar1;
  XMLCh *pXVar2;
  DocTypeHandler *pDVar3;
  XMLReader *this_00;
  XMLBuffer *pXVar4;
  bool bVar5;
  XMLSize_t XVar6;
  Codes CVar7;
  XMLScanner *pXVar8;
  XMLBufBid bbEncoding;
  XMLBufBid bbVersion;
  
  ReaderMgr::skipPastSpaces(this->fReaderMgr);
  pXVar1 = this->fBufMgr;
  bbVersion.fBuffer = XMLBufferMgr::bidOnBuffer(pXVar1);
  bbVersion.fMgr = pXVar1;
  bVar5 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgVersionString);
  if (!bVar5) goto LAB_002f758a;
  bVar5 = scanEq(this);
  CVar7 = ExpectedEqSign;
  if (bVar5) {
    bVar5 = getQuotedString(this,bbVersion.fBuffer);
    pXVar4 = bbVersion.fBuffer;
    CVar7 = BadXMLVersion;
    if (bVar5) {
      pXVar2 = (bbVersion.fBuffer)->fBuffer;
      pXVar2[(bbVersion.fBuffer)->fIndex] = L'\0';
      bVar5 = XMLString::equals(pXVar2,L"1.1");
      if (bVar5) {
        pXVar8 = this->fScanner;
        if (pXVar8->fXMLVersion != XMLV1_1) {
LAB_002f756c:
          pXVar2 = pXVar4->fBuffer;
          pXVar2[pXVar4->fIndex] = L'\0';
          XMLScanner::emitError
                    (pXVar8,UnsupportedXMLVersion,pXVar2,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      else {
        pXVar2 = pXVar4->fBuffer;
        pXVar2[pXVar4->fIndex] = L'\0';
        bVar5 = XMLString::equals(pXVar2,L"1.0");
        if (!bVar5) {
          pXVar8 = this->fScanner;
          goto LAB_002f756c;
        }
      }
LAB_002f758a:
      pXVar1 = this->fBufMgr;
      bbEncoding.fBuffer = XMLBufferMgr::bidOnBuffer(pXVar1);
      bbEncoding.fMgr = pXVar1;
      ReaderMgr::skipPastSpaces(this->fReaderMgr);
      bVar5 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgEncodingString);
      CVar7 = EncodingRequired;
      if (bVar5) {
        bVar5 = scanEq(this);
        CVar7 = ExpectedEqSign;
        if (!bVar5) goto LAB_002f76d4;
        getQuotedString(this,bbEncoding.fBuffer);
        if ((bbEncoding.fBuffer)->fIndex == 0) {
          XVar6 = 0;
LAB_002f7711:
          pXVar8 = this->fScanner;
          pXVar2 = (bbEncoding.fBuffer)->fBuffer;
          pXVar2[XVar6] = L'\0';
          XMLScanner::emitError(pXVar8,BadXMLEncoding,pXVar2,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0)
          ;
          goto LAB_002f76dd;
        }
        pXVar2 = (bbEncoding.fBuffer)->fBuffer;
        pXVar2[(bbEncoding.fBuffer)->fIndex] = L'\0';
        bVar5 = XMLString::isValidEncName(pXVar2);
        if (!bVar5) {
          XVar6 = (bbEncoding.fBuffer)->fIndex;
          goto LAB_002f7711;
        }
        ReaderMgr::skipPastSpaces(this->fReaderMgr);
        bVar5 = ReaderMgr::skippedChar(this->fReaderMgr,L'?');
        if ((!bVar5) || (bVar5 = ReaderMgr::skippedChar(this->fReaderMgr,L'>'), !bVar5)) {
          XMLScanner::emitError(this->fScanner,UnterminatedXMLDecl);
          ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
        }
        pDVar3 = this->fDocTypeHandler;
        if (pDVar3 != (DocTypeHandler *)0x0) {
          (bbVersion.fBuffer)->fBuffer[(bbVersion.fBuffer)->fIndex] = L'\0';
          (bbEncoding.fBuffer)->fBuffer[(bbEncoding.fBuffer)->fIndex] = L'\0';
          (*pDVar3->_vptr_DocTypeHandler[0x11])();
        }
        if ((bbEncoding.fBuffer)->fIndex != 0) {
          this_00 = this->fReaderMgr->fCurReader;
          pXVar2 = (bbEncoding.fBuffer)->fBuffer;
          pXVar2[(bbEncoding.fBuffer)->fIndex] = L'\0';
          bVar5 = XMLReader::setEncoding(this_00,pXVar2);
          if (!bVar5) {
            pXVar8 = this->fScanner;
            pXVar2 = (bbEncoding.fBuffer)->fBuffer;
            pXVar2[(bbEncoding.fBuffer)->fIndex] = L'\0';
            XMLScanner::emitError
                      (pXVar8,ContradictoryEncoding,pXVar2,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
      }
      else {
LAB_002f76d4:
        XMLScanner::emitError(this->fScanner,CVar7);
LAB_002f76dd:
        ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
      }
      XMLBufBid::~XMLBufBid(&bbEncoding);
      goto LAB_002f76f3;
    }
  }
  XMLScanner::emitError(this->fScanner,CVar7);
  ReaderMgr::skipPastChar(this->fReaderMgr,L'>');
LAB_002f76f3:
  XMLBufBid::~XMLBufBid(&bbVersion);
  return;
}

Assistant:

void DTDScanner::scanTextDecl()
{
    // Skip any subsequent whitespace before the version string
    fReaderMgr->skipPastSpaces();

    // Next should be the version string
    XMLBufBid bbVersion(fBufMgr);
    if (fReaderMgr->skippedString(XMLUni::fgVersionString))
    {
        if (!scanEq())
        {
            fScanner->emitError(XMLErrs::ExpectedEqSign);
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        //
        //  Followed by a single or double quoted version. Get a buffer for
        //  the string.
        //
        if (!getQuotedString(bbVersion.getBuffer()))
        {
            fScanner->emitError(XMLErrs::BadXMLVersion);
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        // If its not our supported version, issue an error but continue
        if (XMLString::equals(bbVersion.getRawBuffer(), XMLUni::fgVersion1_1)) {
            if (fScanner->getXMLVersion() != XMLReader::XMLV1_1)
        	    fScanner->emitError(XMLErrs::UnsupportedXMLVersion, bbVersion.getRawBuffer());
        }
        else if (!XMLString::equals(bbVersion.getRawBuffer(), XMLUni::fgVersion1_0))
            fScanner->emitError(XMLErrs::UnsupportedXMLVersion, bbVersion.getRawBuffer());
    }

    // Ok, now we must have an encoding string
    XMLBufBid bbEncoding(fBufMgr);
    fReaderMgr->skipPastSpaces();
    bool gotEncoding = false;
    if (fReaderMgr->skippedString(XMLUni::fgEncodingString))
    {
        // There must be a equal sign next
        if (!scanEq())
        {
            fScanner->emitError(XMLErrs::ExpectedEqSign);
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        // Followed by a single or double quoted version string
        getQuotedString(bbEncoding.getBuffer());
        if (bbEncoding.isEmpty() || !XMLString::isValidEncName(bbEncoding.getRawBuffer()))
        {
            fScanner->emitError(XMLErrs::BadXMLEncoding, bbEncoding.getRawBuffer());
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        // Indicate that we got an encoding
        gotEncoding = true;
    }

    //
    // Encoding declarations are required in the external entity
    // if there is a text declaration present
    //
    if (!gotEncoding)
    {
      fScanner->emitError(XMLErrs::EncodingRequired);
      fReaderMgr->skipPastChar(chCloseAngle);
      return;

    }

    fReaderMgr->skipPastSpaces();
    if (!fReaderMgr->skippedChar(chQuestion))
    {
        fScanner->emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr->skipPastChar(chCloseAngle);
    }
     else if (!fReaderMgr->skippedChar(chCloseAngle))
    {
        fScanner->emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr->skipPastChar(chCloseAngle);
    }

    //
    //  If we have a document type handler and advanced callbacks are on,
    //  then call the TextDecl callback
    //
    if (fDocTypeHandler)
    {
        fDocTypeHandler->TextDecl
        (
            bbVersion.getRawBuffer()
            , bbEncoding.getRawBuffer()
        );
    }

    //
    //  If we got an encoding string, then we have to call back on the reader
    //  to tell it what the encoding is.
    //
    if (!bbEncoding.isEmpty())
    {
        if (!fReaderMgr->getCurrentReader()->setEncoding(bbEncoding.getRawBuffer()))
            fScanner->emitError(XMLErrs::ContradictoryEncoding, bbEncoding.getRawBuffer());
    }
}